

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gbs_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Gbs_Emu::load_(Gbs_Emu *this,Data_Reader *in)

{
  uint uVar1;
  Music_Emu *in_RDI;
  uint load_addr;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  void *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  Gb_Apu *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Classic_Emu *local_8;
  
  local_8 = (Classic_Emu *)
            Rom_Data<16384>::load
                      ((Rom_Data<16384> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (Data_Reader *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       in_stack_ffffffffffffffb8,0);
  if (local_8 == (Classic_Emu *)0x0) {
    Gme_File::set_track_count(&in_RDI->super_Gme_File,(uint)*(byte *)&in_RDI[1].equalizer_.bass);
    local_8 = (Classic_Emu *)check_gbs_header(in_stack_ffffffffffffffb8);
    if (local_8 == (Classic_Emu *)0x0) {
      if (*(char *)((long)&in_RDI[1].equalizer_.treble + 7) != '\x01') {
        Gme_File::set_warning(&in_RDI->super_Gme_File,"Unknown file version");
      }
      if (((ulong)in_RDI[1].equalizer_.d2 & 0x78000000) != 0) {
        Gme_File::set_warning(&in_RDI->super_Gme_File,"Invalid timer mode");
      }
      uVar1 = get_le16((void *)((long)&in_RDI[1].equalizer_.bass + 2));
      if ((0x7f < (byte)(*(byte *)((long)&in_RDI[1].equalizer_.bass + 3) |
                         *(byte *)((long)&in_RDI[1].equalizer_.bass + 5) |
                        *(byte *)((long)&in_RDI[1].equalizer_.bass + 7))) || (uVar1 < 0x400)) {
        Gme_File::set_warning(&in_RDI->super_Gme_File,"Invalid load/init/play address");
      }
      Music_Emu::set_voice_count(in_RDI,4);
      this_00 = (Gb_Apu *)&in_RDI[0x3c].silence_time;
      Music_Emu::gain(in_RDI);
      Gb_Apu::volume(this_00,(double)in_stack_ffffffffffffffb8);
      local_8 = (Classic_Emu *)
                Classic_Emu::setup_buffer(local_8,CONCAT44(uVar1,in_stack_ffffffffffffffd0));
    }
  }
  return (blargg_err_t)local_8;
}

Assistant:

blargg_err_t Gbs_Emu::load_( Data_Reader& in )
{
	assert( offsetof (header_t,copyright [32]) == header_size );
	RETURN_ERR( rom.load( in, header_size, &header_, 0 ) );
	
	set_track_count( header_.track_count );
	RETURN_ERR( check_gbs_header( &header_ ) );
	
	if ( header_.vers != 1 )
		set_warning( "Unknown file version" );
	
	if ( header_.timer_mode & 0x78 )
		set_warning( "Invalid timer mode" );
	
	unsigned load_addr = get_le16( header_.load_addr );
	if ( (header_.load_addr [1] | header_.init_addr [1] | header_.play_addr [1]) > 0x7F ||
			load_addr < 0x400 )
		set_warning( "Invalid load/init/play address" );
	
	set_voice_count( Gb_Apu::osc_count );
	
	apu.volume( gain() );
	
	return setup_buffer( 4194304 );
}